

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O2

_Bool al_register_audio_stream_loader
                (char *ext,_func_ALLEGRO_AUDIO_STREAM_ptr_char_ptr_size_t_uint *stream_loader)

{
  _Bool _Var1;
  size_t sVar2;
  ACODEC_TABLE *pAVar3;
  
  sVar2 = strlen(ext);
  if (sVar2 - 0x1f < 0xffffffffffffffe0) {
LAB_001071a1:
    _Var1 = false;
  }
  else {
    pAVar3 = find_acodec_table_entry(ext);
    if (stream_loader == (_func_ALLEGRO_AUDIO_STREAM_ptr_char_ptr_size_t_uint *)0x0) {
      if ((pAVar3 == (ACODEC_TABLE *)0x0) ||
         (pAVar3->stream_loader == (_func_ALLEGRO_AUDIO_STREAM_ptr_char_ptr_size_t_uint *)0x0))
      goto LAB_001071a1;
    }
    else if (pAVar3 == (ACODEC_TABLE *)0x0) {
      pAVar3 = add_acodec_table_entry(ext);
    }
    pAVar3->stream_loader = stream_loader;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool al_register_audio_stream_loader(const char *ext,
   ALLEGRO_AUDIO_STREAM *(*stream_loader)(const char *filename,
      size_t buffer_count, unsigned int samples))
{
   ACODEC_TABLE *ent;

   if (strlen(ext) + 1 >= MAX_EXTENSION_LENGTH) {
      return false;
   }

   ent = find_acodec_table_entry(ext);
   if (!stream_loader) {
      if (!ent || !ent->stream_loader) {
         return false; /* Nothing to remove. */
      }
   }
   else if (!ent) {
      ent = add_acodec_table_entry(ext);
   }

   ent->stream_loader = stream_loader;

   return true;
}